

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlphaVectorBG.cpp
# Opt level: O1

AlphaVector * __thiscall
AlphaVectorBG::BeliefBackup
          (AlphaVector *__return_storage_ptr__,AlphaVectorBG *this,JointBeliefInterface *b,Index a,
          GaoVectorSet *G,ValueFunctionPOMDPDiscrete *V,BGBackupType type)

{
  _func_int *p_Var1;
  uint uVar2;
  undefined1 local_58 [40];
  
  p_Var1 = this->_vptr_AlphaVectorBG[-3];
  local_58._0_8_ = local_58 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"BeliefBackupBG","");
  TimedAlgorithm::StartTimer
            ((TimedAlgorithm *)((long)&this->_vptr_AlphaVectorBG + (long)p_Var1),(string *)local_58)
  ;
  if ((undefined1 *)local_58._0_8_ != local_58 + 0x10) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  uVar2 = (**(code **)(*(long *)(&b->field_0x0 + *(long *)((long)*b + -0xb8)) + 0x70))
                    (&b->field_0x0 + *(long *)((long)*b + -0xb8));
  AlphaVector::AlphaVector(__return_storage_ptr__,(ulong)uVar2);
  if (type - BGIP_SOLVER_EXHAUSTIVE < 4) {
    BeliefBackupBGIP_Solver((AlphaVector *)local_58,this,b,a,G,V,type);
    AlphaVector::operator=(__return_storage_ptr__,(AlphaVector *)local_58);
  }
  else if (type == EXHAUSTIVE_ONLYKEEPMAX) {
    BeliefBackupExhaustiveOnlyKeepMax((AlphaVector *)local_58,this,b,a,G,V);
    AlphaVector::operator=(__return_storage_ptr__,(AlphaVector *)local_58);
  }
  else {
    if (type != EXHAUSTIVE_STOREALL) goto LAB_003b00ef;
    BeliefBackupExhaustiveStoreAll((AlphaVector *)local_58,this,b,a,G,V);
    AlphaVector::operator=(__return_storage_ptr__,(AlphaVector *)local_58);
  }
  AlphaVector::~AlphaVector((AlphaVector *)local_58);
LAB_003b00ef:
  p_Var1 = this->_vptr_AlphaVectorBG[-3];
  local_58._0_8_ = local_58 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"BeliefBackupBG","");
  TimedAlgorithm::StopTimer
            ((TimedAlgorithm *)((long)&this->_vptr_AlphaVectorBG + (long)p_Var1),(string *)local_58)
  ;
  if ((undefined1 *)local_58._0_8_ != local_58 + 0x10) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

AlphaVector
AlphaVectorBG::BeliefBackup(const JointBeliefInterface &b,
                            Index a,
                            const GaoVectorSet &G,
                            const ValueFunctionPOMDPDiscrete &V,
                            BGBackupType type) const
{
#if DEBUG_AlphaVectorBG_BeliefBackup
    tms timeStruct;
    clock_t ticks_before, ticks_after;
    ticks_before = times(&timeStruct);
#endif

    StartTimer("BeliefBackupBG");

    AlphaVector alpha(b.Size());
    switch(type)
    {
    case EXHAUSTIVE_ONLYKEEPMAX:
        alpha=BeliefBackupExhaustiveOnlyKeepMax(b,a,G,V);
        break;
    case EXHAUSTIVE_STOREALL:
        alpha=BeliefBackupExhaustiveStoreAll(b,a,G,V);
        break;
    case BGIP_SOLVER_EXHAUSTIVE:
    case BGIP_SOLVER_ALTERNATINGMAXIMIZATION:
    case BGIP_SOLVER_ALTERNATINGMAXIMIZATION_100STARTS:
    case BGIP_SOLVER_BRANCH_AND_BOUND:
        alpha=BeliefBackupBGIP_Solver(b,a,G,V,type);
        break;
    }

    StopTimer("BeliefBackupBG");

#if DEBUG_AlphaVectorBG_BeliefBackup
    ticks_after = times(&timeStruct);
    cout << "AlphaVectorBG::BeliefBackup backuptype " << type
         << " done in " 
         << ticks_after - ticks_before << " clock ticks, "
         << static_cast<double>((ticks_after - ticks_before))
        / sysconf(_SC_CLK_TCK) 
         << "s" << endl;
#endif

#if DEBUG_AlphaVectorBG_CheckBGIP_SolverExhaustive
    if(type==BGIP_SOLVER_EXHAUSTIVE)
    {
        AlphaVector alphaOK=BeliefBackup(b,a,G,V,EXHAUSTIVE_ONLYKEEPMAX);
        if(!alphaOK.Equal(alpha))
            abort();
    }
#endif

    return(alpha);
}